

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::chi_square_dist<double>::operator()(chi_square_dist<double> *this,lcg64_shift *r)

{
  double x;
  result_type_conflict2 rVar1;
  
  x = utility::u01xx_traits<double,_1UL,_trng::lcg64_shift>::co(r);
  rVar1 = icdf_(this,x);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformco<result_type>(r));
    }